

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O1

void __thiscall OpenMD::Velocitizer::randomizeChargeVelocity(Velocitizer *this,RealType temperature)

{
  SimInfo *info;
  FluctuatingChargeParameters *pFVar1;
  Atom *pAVar2;
  double dVar3;
  result_type_conflict1 rVar4;
  Molecule *pMVar5;
  pointer ppAVar6;
  pointer ppAVar7;
  Molecule *pMVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  FluctuatingChargeConstraints *this_00;
  Molecule *pMVar12;
  long lVar13;
  Atom *atom;
  StuntDouble *pSVar14;
  long lVar15;
  pointer ppSVar16;
  double dVar17;
  MoleculeIterator mi;
  FluctuatingChargeAdapter fqa;
  MoleculeIterator local_90;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_88;
  FluctuatingChargeConstraints *local_70;
  Molecule *local_68;
  pointer local_60;
  normal_distribution<double> local_58;
  
  local_90._M_node = (_Base_ptr)0x0;
  local_58._M_param._M_mean._0_4_ = 0;
  local_58._M_param._M_mean._4_4_ = 0;
  local_58._M_param._M_stddev._0_4_ = 0;
  local_58._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_58._M_saved = 0.0;
  local_58._M_saved_available = false;
  info = this->info_;
  pFVar1 = info->simParams_->flucQpars_;
  this_00 = (FluctuatingChargeConstraints *)operator_new(0x88);
  FluctuatingChargeConstraints::FluctuatingChargeConstraints(this_00,info);
  FluctuatingChargeConstraints::setConstrainRegions
            (this_00,(bool)(pFVar1->ConstrainRegions).super_ParameterBase.field_0x2b);
  iVar10 = FluctuatingChargeConstraints::getNumberOfFlucQConstraints(this_00);
  local_70 = this_00;
  iVar11 = FluctuatingChargeConstraints::getNumberOfFlucQAtoms(this_00);
  pMVar12 = SimInfo::beginMolecule(this->info_,&local_90);
  if (pMVar12 != (Molecule *)0x0) {
    dVar17 = ((double)iVar11 * 0.0019872156 * temperature) / (double)((iVar11 - iVar10) * 2);
    dVar17 = dVar17 + dVar17;
    do {
      ppSVar16 = (pMVar12->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pMVar8 = pMVar12;
      pMVar5 = local_68;
      if (ppSVar16 ==
          (pMVar12->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar14 = (StuntDouble *)0x0;
      }
      else {
        pSVar14 = *ppSVar16;
      }
      while (local_68 = pMVar8, pSVar14 != (StuntDouble *)0x0) {
        if (pSVar14->objType_ < otRigidBody) {
          local_88.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pSVar14[1]._vptr_StuntDouble;
          bVar9 = FluctuatingChargeAdapter::isFluctuatingCharge
                            ((FluctuatingChargeAdapter *)&local_88);
          if (bVar9) {
            dVar3 = dVar17 / *(double *)&pSVar14[1].objType_;
            if (dVar3 < 0.0) {
              dVar3 = sqrt(dVar3);
            }
            else {
              dVar3 = SQRT(dVar3);
            }
            rVar4 = std::normal_distribution<double>::operator()
                              (&local_58,
                               (this->randNumGen_).
                               super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&local_58._M_param);
            *(double *)
             (*(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).flucQVel.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + pSVar14->storage_) +
             (long)pSVar14->localIndex_ * 8) = rVar4 * dVar3;
          }
        }
        if (pSVar14->objType_ == otRigidBody) {
          std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                    (&local_88,
                     (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&pSVar14[2].mass_);
          ppAVar7 = local_88.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppAVar6 = local_88.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_60 = ppSVar16;
          if ((long)local_88.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            lVar13 = (long)local_88.
                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_88.
                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3;
            lVar15 = 0;
            do {
              pAVar2 = ppAVar6[lVar15];
              local_88.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)pAVar2->atomType_;
              bVar9 = FluctuatingChargeAdapter::isFluctuatingCharge
                                ((FluctuatingChargeAdapter *)&local_88);
              if (bVar9) {
                dVar3 = dVar17 / pAVar2->chargeMass_;
                if (dVar3 < 0.0) {
                  dVar3 = sqrt(dVar3);
                }
                else {
                  dVar3 = SQRT(dVar3);
                }
                rVar4 = std::normal_distribution<double>::operator()
                                  (&local_58,
                                   (this->randNumGen_).
                                   super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,&local_58._M_param);
                *(double *)
                 (*(long *)((long)&(((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).flucQVel.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (pAVar2->super_StuntDouble).storage_) +
                 (long)(pAVar2->super_StuntDouble).localIndex_ * 8) = dVar3 * rVar4;
              }
              lVar15 = lVar15 + 1;
            } while (lVar13 + (ulong)(lVar13 == 0) != lVar15);
          }
          ppSVar16 = local_60;
          pMVar12 = local_68;
          if (ppAVar6 != (pointer)0x0) {
            operator_delete(ppAVar6,(long)ppAVar7 - (long)ppAVar6);
          }
        }
        ppSVar16 = ppSVar16 + 1;
        pMVar8 = local_68;
        pMVar5 = local_68;
        if (ppSVar16 ==
            (pMVar12->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar14 = (StuntDouble *)0x0;
        }
        else {
          pSVar14 = *ppSVar16;
        }
      }
      local_68 = pMVar5;
      pMVar12 = SimInfo::nextMolecule(this->info_,&local_90);
    } while (pMVar12 != (Molecule *)0x0);
  }
  FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities(local_70);
  return;
}

Assistant:

void Velocitizer::randomizeChargeVelocity(RealType temperature) {
    RealType aw2;
    RealType kebar;
    RealType wbar;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    FluctuatingChargeParameters* fqParams;
    FluctuatingChargeConstraints* fqConstraints;

    std::normal_distribution<RealType> normalDistribution {0.0, 1.0};

    Globals* simParams = info_->getSimParams();
    fqParams           = simParams->getFluctuatingChargeParameters();

    fqConstraints = new FluctuatingChargeConstraints(info_);
    fqConstraints->setConstrainRegions(fqParams->getConstrainRegions());

    int nConstrain =
        fqConstraints
            ->getNumberOfFlucQConstraints();  // no of constraints in charge
    int dfRaw = fqConstraints->getNumberOfFlucQAtoms();  // no of FlucQ freedom
    int dfActual = dfRaw - nConstrain;
    kebar        = dfRaw * Constants::kb * temperature / (2 * dfActual);

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        if (sd->isAtom()) {
          Atom* atom                   = static_cast<Atom*>(sd);
          AtomType* atomType           = atom->getAtomType();
          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
          if (fqa.isFluctuatingCharge()) {
            // uses equipartition theory to solve for vbar in angstrom/fs

            aw2  = 2.0 * kebar / atom->getChargeMass();
            wbar = sqrt(aw2);

            // picks random velocities from a gaussian distribution
            // centered on vbar
            atom->setFlucQVel(wbar * normalDistribution(*randNumGen_));
          }
        }

        // randomization of the charge velocities for atoms in the rigidbody

        if (sd->isRigidBody()) {
          RigidBody* rigidbody = static_cast<RigidBody*>(sd);
          vector<Atom*> atomList;
          atomList = rigidbody->getAtoms();

          for (size_t i = 0; i < atomList.size(); ++i) {
            Atom* atom                   = atomList[i];
            AtomType* atomType           = atom->getAtomType();
            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) {
              // uses equipartition theory to solve for vbar in angstrom/fs
              aw2  = 2.0 * kebar / atom->getChargeMass();
              wbar = sqrt(aw2);
              // picks random velocities from a gaussian distribution
              // centered on vbar
              atom->setFlucQVel(wbar * normalDistribution(*randNumGen_));
            }
          }
        }
      }
    }
    fqConstraints->applyConstraintsOnChargeVelocities();
  }